

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O1

void __thiscall flow::util::RegExp::RegExp(RegExp *this,RegExp *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  
  paVar1 = &(this->pattern_).field_2;
  (this->pattern_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (v->pattern_)._M_dataplus._M_p;
  paVar2 = &(v->pattern_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(v->pattern_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->pattern_).field_2 + 8) = uVar5;
  }
  else {
    (this->pattern_)._M_dataplus._M_p = pcVar3;
    (this->pattern_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->pattern_)._M_string_length = (v->pattern_)._M_string_length;
  (v->pattern_)._M_dataplus._M_p = (pointer)paVar2;
  (v->pattern_)._M_string_length = 0;
  (v->pattern_).field_2._M_local_buf[0] = '\0';
  (this->re_)._M_flags = (v->re_)._M_flags;
  std::locale::locale(&(this->re_)._M_loc,&(v->re_)._M_loc);
  (this->re_)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (v->re_)._M_automaton.
            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (this->re_)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (v->re_)._M_automaton.
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (v->re_)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->re_)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  (v->re_)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  return;
}

Assistant:

RegExp::RegExp(RegExp&& v)
    : pattern_(std::move(v.pattern_)),
      re_(std::move(v.re_)) {
}